

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void show_battlefield_open
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
                *battle_field)

{
  ostream *poVar1;
  mapped_type *pmVar2;
  int iVar3;
  string coordinates;
  char local_55;
  int local_54;
  key_type local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"A0","");
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  A B C D E F G H I J",0x15);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-----------------------",0x17);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  iVar3 = 0;
  do {
    *local_50._M_dataplus._M_p = 'A';
    local_54 = iVar3;
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"|",1);
    iVar3 = 10;
    do {
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
               ::operator[](battle_field,&local_50);
      switch(*pmVar2) {
      case 0:
        local_55 = ' ';
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_55,1);
        break;
      case 1:
        local_55 = '*';
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_55,1);
        break;
      case 2:
        local_55 = '+';
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_55,1);
        break;
      case 3:
        local_55 = ' ';
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_55,1);
        break;
      case 4:
        local_55 = '#';
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_55,1);
        break;
      default:
        local_55 = '&';
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_55,1);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      *local_50._M_dataplus._M_p = *local_50._M_dataplus._M_p + '\x01';
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"|",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
    std::ostream::put(-0x40);
    std::ostream::flush();
    local_50._M_dataplus._M_p[1] = local_50._M_dataplus._M_p[1] + '\x01';
    iVar3 = local_54 + 1;
  } while (iVar3 != 10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-----------------------",0x17);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

void show_battlefield_open (map <string, unsigned short> battle_field){
    int i=0, j=0;
    string coordinates="A0";
    cout<<"  A B C D E F G H I J"<<endl;
    cout<<"-----------------------"<<endl;
    for(i=0;i<10;i++){
        coordinates[0]='A';
        cout<<i<<"|";
        for(j=0;j<10;j++){
            switch (battle_field[coordinates]) {
                case 0:cout << ' ';break;
                case 1:cout << '*';break;
                case 2:cout << '+';break;
                case 3:cout << ' ';break;
                case 4:cout << '#';break;
                default: cout<<'&';
            }
            cout<<" ";
            coordinates[0]++;
        }
        cout<<"|";
        cout<<endl;
        coordinates[1]++;
    }
    cout<<"-----------------------"<<endl;
}